

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_segment.cpp
# Opt level: O1

void duckdb::FilterSelectionSwitch<bool>
               (UnifiedVectorFormat *vdata,bool predicate,SelectionVector *sel,
               idx_t *approved_tuple_count,ExpressionType comparison_type)

{
  data_t dVar1;
  byte bVar2;
  data_ptr_t pdVar3;
  unsigned_long *puVar4;
  idx_t iVar5;
  sel_t *psVar6;
  sel_t *psVar7;
  idx_t iVar8;
  NotImplementedException *this;
  undefined7 in_register_00000081;
  idx_t iVar9;
  idx_t iVar10;
  idx_t iVar11;
  ulong uVar12;
  SelectionVector new_sel;
  SelectionVector local_68;
  string local_50;
  
  SelectionVector::SelectionVector(&local_68,*approved_tuple_count);
  switch((int)CONCAT71(in_register_00000081,comparison_type)) {
  case 0x19:
    pdVar3 = vdata->data;
    puVar4 = (vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    iVar5 = *approved_tuple_count;
    if (puVar4 == (unsigned_long *)0x0) {
      if (iVar5 != 0) {
        psVar6 = sel->sel_vector;
        psVar7 = vdata->sel->sel_vector;
        iVar8 = 0;
        iVar9 = 0;
        do {
          iVar10 = iVar9;
          if (psVar6 != (sel_t *)0x0) {
            iVar10 = (idx_t)psVar6[iVar9];
          }
          iVar11 = iVar10;
          if (psVar7 != (sel_t *)0x0) {
            iVar11 = (idx_t)psVar7[iVar10];
          }
          dVar1 = pdVar3[iVar11];
          local_68.sel_vector[iVar8] = (sel_t)iVar10;
          iVar8 = iVar8 + ((bool)dVar1 == predicate);
          iVar9 = iVar9 + 1;
        } while (iVar5 != iVar9);
        goto LAB_010ff86d;
      }
    }
    else if (iVar5 != 0) {
      psVar6 = sel->sel_vector;
      psVar7 = vdata->sel->sel_vector;
      iVar8 = 0;
      iVar9 = 0;
      do {
        iVar10 = iVar9;
        if (psVar6 != (sel_t *)0x0) {
          iVar10 = (idx_t)psVar6[iVar9];
        }
        iVar11 = iVar10;
        if (psVar7 != (sel_t *)0x0) {
          iVar11 = (idx_t)psVar7[iVar10];
        }
        if ((puVar4[iVar11 >> 6] >> (iVar11 & 0x3f) & 1) == 0) {
          uVar12 = 0;
        }
        else {
          uVar12 = (ulong)((bool)pdVar3[iVar11] == predicate);
        }
        local_68.sel_vector[iVar8] = (sel_t)iVar10;
        iVar8 = iVar8 + uVar12;
        iVar9 = iVar9 + 1;
      } while (iVar5 != iVar9);
      goto LAB_010ff86d;
    }
    break;
  case 0x1a:
    pdVar3 = vdata->data;
    puVar4 = (vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    iVar5 = *approved_tuple_count;
    if (puVar4 == (unsigned_long *)0x0) {
      if (iVar5 != 0) {
        psVar6 = sel->sel_vector;
        psVar7 = vdata->sel->sel_vector;
        iVar8 = 0;
        iVar9 = 0;
        do {
          iVar10 = iVar9;
          if (psVar6 != (sel_t *)0x0) {
            iVar10 = (idx_t)psVar6[iVar9];
          }
          iVar11 = iVar10;
          if (psVar7 != (sel_t *)0x0) {
            iVar11 = (idx_t)psVar7[iVar10];
          }
          dVar1 = pdVar3[iVar11];
          local_68.sel_vector[iVar8] = (sel_t)iVar10;
          iVar8 = iVar8 + ((bool)dVar1 != predicate);
          iVar9 = iVar9 + 1;
        } while (iVar5 != iVar9);
        goto LAB_010ff86d;
      }
    }
    else if (iVar5 != 0) {
      psVar6 = sel->sel_vector;
      psVar7 = vdata->sel->sel_vector;
      iVar8 = 0;
      iVar9 = 0;
      do {
        iVar10 = iVar9;
        if (psVar6 != (sel_t *)0x0) {
          iVar10 = (idx_t)psVar6[iVar9];
        }
        iVar11 = iVar10;
        if (psVar7 != (sel_t *)0x0) {
          iVar11 = (idx_t)psVar7[iVar10];
        }
        if ((puVar4[iVar11 >> 6] >> (iVar11 & 0x3f) & 1) == 0) {
          uVar12 = 0;
        }
        else {
          uVar12 = (ulong)((bool)pdVar3[iVar11] != predicate);
        }
        local_68.sel_vector[iVar8] = (sel_t)iVar10;
        iVar8 = iVar8 + uVar12;
        iVar9 = iVar9 + 1;
      } while (iVar5 != iVar9);
      goto LAB_010ff86d;
    }
    break;
  case 0x1b:
    pdVar3 = vdata->data;
    puVar4 = (vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    iVar5 = *approved_tuple_count;
    if (puVar4 == (unsigned_long *)0x0) {
      if (iVar5 != 0) {
        psVar6 = sel->sel_vector;
        psVar7 = vdata->sel->sel_vector;
        iVar8 = 0;
        iVar9 = 0;
        do {
          iVar10 = iVar9;
          if (psVar6 != (sel_t *)0x0) {
            iVar10 = (idx_t)psVar6[iVar9];
          }
          iVar11 = iVar10;
          if (psVar7 != (sel_t *)0x0) {
            iVar11 = (idx_t)psVar7[iVar10];
          }
          bVar2 = pdVar3[iVar11];
          local_68.sel_vector[iVar8] = (sel_t)iVar10;
          iVar8 = iVar8 + (~bVar2 & predicate);
          iVar9 = iVar9 + 1;
        } while (iVar5 != iVar9);
        goto LAB_010ff86d;
      }
    }
    else if (iVar5 != 0) {
      psVar6 = sel->sel_vector;
      psVar7 = vdata->sel->sel_vector;
      iVar8 = 0;
      iVar9 = 0;
      do {
        iVar10 = iVar9;
        if (psVar6 != (sel_t *)0x0) {
          iVar10 = (idx_t)psVar6[iVar9];
        }
        iVar11 = iVar10;
        if (psVar7 != (sel_t *)0x0) {
          iVar11 = (idx_t)psVar7[iVar10];
        }
        if ((puVar4[iVar11 >> 6] >> (iVar11 & 0x3f) & 1) == 0) {
          uVar12 = 0;
        }
        else {
          uVar12 = (ulong)(~pdVar3[iVar11] & predicate);
        }
        local_68.sel_vector[iVar8] = (sel_t)iVar10;
        iVar8 = iVar8 + uVar12;
        iVar9 = iVar9 + 1;
      } while (iVar5 != iVar9);
      goto LAB_010ff86d;
    }
    break;
  case 0x1c:
    pdVar3 = vdata->data;
    puVar4 = (vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    iVar5 = *approved_tuple_count;
    if (puVar4 == (unsigned_long *)0x0) {
      if (iVar5 != 0) {
        psVar6 = sel->sel_vector;
        psVar7 = vdata->sel->sel_vector;
        iVar8 = 0;
        iVar9 = 0;
        do {
          iVar10 = iVar9;
          if (psVar6 != (sel_t *)0x0) {
            iVar10 = (idx_t)psVar6[iVar9];
          }
          iVar11 = iVar10;
          if (psVar7 != (sel_t *)0x0) {
            iVar11 = (idx_t)psVar7[iVar10];
          }
          uVar12 = 0;
          if (!predicate) {
            uVar12 = (ulong)pdVar3[iVar11];
          }
          local_68.sel_vector[iVar8] = (sel_t)iVar10;
          iVar8 = iVar8 + uVar12;
          iVar9 = iVar9 + 1;
        } while (iVar5 != iVar9);
        goto LAB_010ff86d;
      }
    }
    else if (iVar5 != 0) {
      psVar6 = sel->sel_vector;
      psVar7 = vdata->sel->sel_vector;
      iVar8 = 0;
      iVar9 = 0;
      do {
        iVar10 = iVar9;
        if (psVar6 != (sel_t *)0x0) {
          iVar10 = (idx_t)psVar6[iVar9];
        }
        iVar11 = iVar10;
        if (psVar7 != (sel_t *)0x0) {
          iVar11 = (idx_t)psVar7[iVar10];
        }
        if ((puVar4[iVar11 >> 6] >> (iVar11 & 0x3f) & 1) == 0) {
          uVar12 = 0;
        }
        else {
          uVar12 = 0;
          if (!predicate) {
            uVar12 = (ulong)pdVar3[iVar11];
          }
        }
        local_68.sel_vector[iVar8] = (sel_t)iVar10;
        iVar8 = iVar8 + uVar12;
        iVar9 = iVar9 + 1;
      } while (iVar5 != iVar9);
      goto LAB_010ff86d;
    }
    break;
  case 0x1d:
    pdVar3 = vdata->data;
    puVar4 = (vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    iVar5 = *approved_tuple_count;
    if (puVar4 == (unsigned_long *)0x0) {
      if (iVar5 != 0) {
        psVar6 = sel->sel_vector;
        psVar7 = vdata->sel->sel_vector;
        iVar8 = 0;
        iVar9 = 0;
        do {
          iVar10 = iVar9;
          if (psVar6 != (sel_t *)0x0) {
            iVar10 = (idx_t)psVar6[iVar9];
          }
          iVar11 = iVar10;
          if (psVar7 != (sel_t *)0x0) {
            iVar11 = (idx_t)psVar7[iVar10];
          }
          uVar12 = (ulong)pdVar3[iVar11] ^ 1;
          if (predicate) {
            uVar12 = 1;
          }
          local_68.sel_vector[iVar8] = (sel_t)iVar10;
          iVar8 = iVar8 + uVar12;
          iVar9 = iVar9 + 1;
        } while (iVar5 != iVar9);
        goto LAB_010ff86d;
      }
    }
    else if (iVar5 != 0) {
      psVar6 = sel->sel_vector;
      psVar7 = vdata->sel->sel_vector;
      iVar8 = 0;
      iVar9 = 0;
      do {
        iVar10 = iVar9;
        if (psVar6 != (sel_t *)0x0) {
          iVar10 = (idx_t)psVar6[iVar9];
        }
        iVar11 = iVar10;
        if (psVar7 != (sel_t *)0x0) {
          iVar11 = (idx_t)psVar7[iVar10];
        }
        if ((puVar4[iVar11 >> 6] >> (iVar11 & 0x3f) & 1) == 0) {
          uVar12 = 0;
        }
        else {
          uVar12 = (ulong)pdVar3[iVar11] ^ 1;
          if (predicate) {
            uVar12 = 1;
          }
        }
        local_68.sel_vector[iVar8] = (sel_t)iVar10;
        iVar8 = iVar8 + uVar12;
        iVar9 = iVar9 + 1;
      } while (iVar5 != iVar9);
      goto LAB_010ff86d;
    }
    break;
  case 0x1e:
    pdVar3 = vdata->data;
    puVar4 = (vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    iVar5 = *approved_tuple_count;
    if (puVar4 == (unsigned_long *)0x0) {
      if (iVar5 != 0) {
        psVar6 = sel->sel_vector;
        psVar7 = vdata->sel->sel_vector;
        iVar8 = 0;
        iVar9 = 0;
        do {
          iVar10 = iVar9;
          if (psVar6 != (sel_t *)0x0) {
            iVar10 = (idx_t)psVar6[iVar9];
          }
          iVar11 = iVar10;
          if (psVar7 != (sel_t *)0x0) {
            iVar11 = (idx_t)psVar7[iVar10];
          }
          bVar2 = pdVar3[iVar11];
          local_68.sel_vector[iVar8] = (sel_t)iVar10;
          iVar8 = iVar8 + (bVar2 | !predicate);
          iVar9 = iVar9 + 1;
        } while (iVar5 != iVar9);
        goto LAB_010ff86d;
      }
    }
    else if (iVar5 != 0) {
      psVar6 = sel->sel_vector;
      psVar7 = vdata->sel->sel_vector;
      iVar8 = 0;
      iVar9 = 0;
      do {
        iVar10 = iVar9;
        if (psVar6 != (sel_t *)0x0) {
          iVar10 = (idx_t)psVar6[iVar9];
        }
        iVar11 = iVar10;
        if (psVar7 != (sel_t *)0x0) {
          iVar11 = (idx_t)psVar7[iVar10];
        }
        if ((puVar4[iVar11 >> 6] >> (iVar11 & 0x3f) & 1) == 0) {
          uVar12 = 0;
        }
        else {
          uVar12 = (ulong)(pdVar3[iVar11] | !predicate);
        }
        local_68.sel_vector[iVar8] = (sel_t)iVar10;
        iVar8 = iVar8 + uVar12;
        iVar9 = iVar9 + 1;
      } while (iVar5 != iVar9);
      goto LAB_010ff86d;
    }
    break;
  default:
    this = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"Unknown comparison type for filter pushed down to table!","");
    NotImplementedException::NotImplementedException(this,&local_50);
    __cxa_throw(this,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  }
  iVar8 = 0;
LAB_010ff86d:
  *approved_tuple_count = iVar8;
  shared_ptr<duckdb::SelectionData,_true>::operator=(&sel->selection_data,&local_68.selection_data);
  sel->sel_vector = local_68.sel_vector;
  if (local_68.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_68.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  return;
}

Assistant:

static void FilterSelectionSwitch(UnifiedVectorFormat &vdata, T predicate, SelectionVector &sel,
                                  idx_t &approved_tuple_count, ExpressionType comparison_type) {
	SelectionVector new_sel(approved_tuple_count);
	auto &mask = vdata.validity;
	// the inplace loops take the result as the last parameter
	switch (comparison_type) {
	case ExpressionType::COMPARE_EQUAL: {
		if (mask.AllValid()) {
			approved_tuple_count =
			    TemplatedFilterSelection<T, Equals, false>(vdata, predicate, sel, approved_tuple_count, new_sel);
		} else {
			approved_tuple_count =
			    TemplatedFilterSelection<T, Equals, true>(vdata, predicate, sel, approved_tuple_count, new_sel);
		}
		break;
	}
	case ExpressionType::COMPARE_NOTEQUAL: {
		if (mask.AllValid()) {
			approved_tuple_count =
			    TemplatedFilterSelection<T, NotEquals, false>(vdata, predicate, sel, approved_tuple_count, new_sel);
		} else {
			approved_tuple_count =
			    TemplatedFilterSelection<T, NotEquals, true>(vdata, predicate, sel, approved_tuple_count, new_sel);
		}
		break;
	}
	case ExpressionType::COMPARE_LESSTHAN: {
		if (mask.AllValid()) {
			approved_tuple_count =
			    TemplatedFilterSelection<T, LessThan, false>(vdata, predicate, sel, approved_tuple_count, new_sel);
		} else {
			approved_tuple_count =
			    TemplatedFilterSelection<T, LessThan, true>(vdata, predicate, sel, approved_tuple_count, new_sel);
		}
		break;
	}
	case ExpressionType::COMPARE_GREATERTHAN: {
		if (mask.AllValid()) {
			approved_tuple_count =
			    TemplatedFilterSelection<T, GreaterThan, false>(vdata, predicate, sel, approved_tuple_count, new_sel);
		} else {
			approved_tuple_count =
			    TemplatedFilterSelection<T, GreaterThan, true>(vdata, predicate, sel, approved_tuple_count, new_sel);
		}
		break;
	}
	case ExpressionType::COMPARE_LESSTHANOREQUALTO: {
		if (mask.AllValid()) {
			approved_tuple_count = TemplatedFilterSelection<T, LessThanEquals, false>(vdata, predicate, sel,
			                                                                          approved_tuple_count, new_sel);
		} else {
			approved_tuple_count =
			    TemplatedFilterSelection<T, LessThanEquals, true>(vdata, predicate, sel, approved_tuple_count, new_sel);
		}
		break;
	}
	case ExpressionType::COMPARE_GREATERTHANOREQUALTO: {
		if (mask.AllValid()) {
			approved_tuple_count = TemplatedFilterSelection<T, GreaterThanEquals, false>(vdata, predicate, sel,
			                                                                             approved_tuple_count, new_sel);
		} else {
			approved_tuple_count = TemplatedFilterSelection<T, GreaterThanEquals, true>(vdata, predicate, sel,
			                                                                            approved_tuple_count, new_sel);
		}
		break;
	}
	default:
		throw NotImplementedException("Unknown comparison type for filter pushed down to table!");
	}
	sel.Initialize(new_sel);
}